

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3RollbackAll(sqlite3 *db,int tripCode)

{
  Btree *p_00;
  bool bVar1;
  int iVar2;
  bool bVar3;
  Btree *p;
  int schemaChange;
  int inTrans;
  int i;
  int tripCode_local;
  sqlite3 *db_local;
  
  bVar1 = false;
  sqlite3BeginBenignMalloc();
  sqlite3BtreeEnterAll(db);
  bVar3 = false;
  if ((db->mDbFlags & 1) != 0) {
    bVar3 = (db->init).busy == '\0';
  }
  for (schemaChange = 0; schemaChange < db->nDb; schemaChange = schemaChange + 1) {
    p_00 = db->aDb[schemaChange].pBt;
    if (p_00 != (Btree *)0x0) {
      iVar2 = sqlite3BtreeTxnState(p_00);
      if (iVar2 == 2) {
        bVar1 = true;
      }
      sqlite3BtreeRollback(p_00,tripCode,(uint)((bVar3 ^ 0xffU) & 1));
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();
  if (bVar3) {
    sqlite3ExpirePreparedStatements(db,0);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags = db->flags & 0xfffffffdfff7ffff;
  if ((db->xRollbackCallback != (_func_void_void_ptr *)0x0) && ((bVar1 || (db->autoCommit == '\0')))
     ) {
    (*db->xRollbackCallback)(db->pRollbackArg);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RollbackAll(sqlite3 *db, int tripCode){
  int i;
  int inTrans = 0;
  int schemaChange;
  assert( sqlite3_mutex_held(db->mutex) );
  sqlite3BeginBenignMalloc();

  /* Obtain all b-tree mutexes before making any calls to BtreeRollback().
  ** This is important in case the transaction being rolled back has
  ** modified the database schema. If the b-tree mutexes are not taken
  ** here, then another shared-cache connection might sneak in between
  ** the database rollback and schema reset, which can cause false
  ** corruption reports in some cases.  */
  sqlite3BtreeEnterAll(db);
  schemaChange = (db->mDbFlags & DBFLAG_SchemaChange)!=0 && db->init.busy==0;

  for(i=0; i<db->nDb; i++){
    Btree *p = db->aDb[i].pBt;
    if( p ){
      if( sqlite3BtreeTxnState(p)==SQLITE_TXN_WRITE ){
        inTrans = 1;
      }
      sqlite3BtreeRollback(p, tripCode, !schemaChange);
    }
  }
  sqlite3VtabRollback(db);
  sqlite3EndBenignMalloc();

  if( schemaChange ){
    sqlite3ExpirePreparedStatements(db, 0);
    sqlite3ResetAllSchemasOfConnection(db);
  }
  sqlite3BtreeLeaveAll(db);

  /* Any deferred constraint violations have now been resolved. */
  db->nDeferredCons = 0;
  db->nDeferredImmCons = 0;
  db->flags &= ~(u64)(SQLITE_DeferFKs|SQLITE_CorruptRdOnly);

  /* If one has been configured, invoke the rollback-hook callback */
  if( db->xRollbackCallback && (inTrans || !db->autoCommit) ){
    db->xRollbackCallback(db->pRollbackArg);
  }
}